

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void statement(LexState *ls)

{
  l_uint32 *plVar1;
  byte bVar2;
  FuncState *pFVar3;
  Instruction *pIVar4;
  BlockCnt *pBVar5;
  undefined1 uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  TString *pTVar13;
  LocVar *pLVar14;
  TString *pTVar15;
  Labeldesc *pLVar16;
  char *pcVar17;
  FuncState *pFVar18;
  long lVar19;
  Vardesc *v;
  bool bVar20;
  int local_74;
  BlockCnt bl1;
  BlockCnt local_48;
  
  iVar12 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar9 = (ls->t).token;
  switch(iVar9) {
  case 0x101:
    iVar12 = ls->linenumber;
    luaX_next(ls);
    pTVar15 = luaS_newlstr(ls->L,"break",5);
    iVar9 = luaK_jump(ls->fs);
    goto LAB_00142f4e;
  case 0x102:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar12);
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10b:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x112:
  case 0x113:
  case 0x114:
    goto switchD_00142706_caseD_103;
  case 0x107:
    pFVar18 = ls->fs;
    iVar8 = 1;
    enterblock(pFVar18,&local_48,'\x01');
    luaX_next(ls);
    pTVar15 = str_checkname(ls);
    iVar9 = (ls->t).token;
    if ((iVar9 == 0x2c) || (iVar9 == 0x10b)) {
      pFVar3 = ls->fs;
      bVar2 = pFVar3->freereg;
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      new_localvar(ls,pTVar15);
      while (iVar9 = testnext(ls,0x2c), iVar9 != 0) {
        pTVar15 = str_checkname(ls);
        new_localvar(ls,pTVar15);
        iVar8 = iVar8 + 1;
      }
      checknext(ls,0x10b);
      iVar9 = ls->linenumber;
      iVar10 = explist(ls,(expdesc *)&bl1);
      adjust_assign(ls,4,iVar10,(expdesc *)&bl1);
      adjustlocalvars(ls,4);
      pBVar5 = pFVar3->bl;
      pBVar5->upval = '\x01';
      pBVar5->insidetbc = '\x01';
      pFVar3->needclose = '\x01';
      luaK_checkstack(pFVar3,3);
      forbody(ls,(uint)bVar2,iVar9,iVar8,1);
    }
    else {
      if (iVar9 != 0x3d) {
        pcVar17 = "\'=\' or \'in\' expected";
        goto LAB_00143293;
      }
      pFVar3 = ls->fs;
      bVar2 = pFVar3->freereg;
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      new_localvar(ls,pTVar15);
      checknext(ls,0x3d);
      exp1(ls);
      checknext(ls,0x2c);
      exp1(ls);
      iVar9 = testnext(ls,0x2c);
      if (iVar9 == 0) {
        luaK_int(pFVar3,(uint)pFVar3->freereg,1);
        luaK_reserveregs(pFVar3,1);
      }
      else {
        exp1(ls);
      }
      adjustlocalvars(ls,3);
      forbody(ls,(uint)bVar2,iVar12,1,0);
    }
    check_match(ls,0x105,0x107,iVar12);
    goto LAB_001431e2;
  case 0x108:
    luaX_next(ls);
    singlevar(ls,(expdesc *)&bl1);
    while (iVar9 = (ls->t).token, iVar9 == 0x2e) {
      fieldsel(ls,(expdesc *)&bl1);
    }
    if (iVar9 == 0x3a) {
      fieldsel(ls,(expdesc *)&bl1);
    }
    body(ls,(expdesc *)&local_48,(uint)(iVar9 == 0x3a),iVar12);
    check_readonly(ls,(expdesc *)&bl1);
    luaK_storevar(ls->fs,(expdesc *)&bl1,(expdesc *)&local_48);
    luaK_fixline(ls->fs,iVar12);
    break;
  case 0x109:
    luaX_next(ls);
    pFVar18 = ls->fs;
    iVar12 = ls->linenumber;
    pTVar15 = str_checkname(ls);
    pLVar16 = findlabel(ls,pTVar15);
    if (pLVar16 != (Labeldesc *)0x0) {
      iVar12 = reglevel(pFVar18,(uint)pLVar16->nactvar);
      iVar9 = luaY_nvarstack(pFVar18);
      if (iVar12 < iVar9) {
        luaK_codeABCk(pFVar18,OP_CLOSE,iVar12,0,0,0);
      }
      iVar12 = luaK_jump(pFVar18);
      luaK_patchlist(pFVar18,iVar12,pLVar16->pc);
      break;
    }
    iVar9 = luaK_jump(pFVar18);
LAB_00142f4e:
    newgotoentry(ls,pTVar15,iVar12,iVar9);
    break;
  case 0x10a:
    pFVar18 = ls->fs;
    local_74 = -1;
    do {
      pFVar3 = ls->fs;
      luaX_next(ls);
      expr(ls,(expdesc *)&local_48);
      checknext(ls,0x112);
      if ((ls->t).token == 0x101) {
        iVar9 = ls->linenumber;
        luaK_goiffalse(ls->fs,(expdesc *)&local_48);
        luaX_next(ls);
        enterblock(pFVar3,&bl1,'\0');
        pTVar15 = luaS_newlstr(ls->L,"break",5);
        newgotoentry(ls,pTVar15,iVar9,local_48._16_4_);
        do {
          iVar9 = testnext(ls,0x3b);
        } while (iVar9 != 0);
        uVar7 = (ls->t).token - 0x103;
        if ((0x1d < uVar7) || ((0x20000007U >> (uVar7 & 0x1f) & 1) == 0)) {
          iVar9 = luaK_jump(pFVar3);
          goto LAB_00142c0b;
        }
        leaveblock(pFVar3);
      }
      else {
        luaK_goiftrue(ls->fs,(expdesc *)&local_48);
        enterblock(pFVar3,&bl1,'\0');
        iVar9 = local_48._20_4_;
LAB_00142c0b:
        statlist(ls);
        leaveblock(pFVar3);
        if ((ls->t).token - 0x103U < 2) {
          iVar8 = luaK_jump(pFVar3);
          luaK_concat(pFVar3,&local_74,iVar8);
        }
        luaK_patchtohere(pFVar3,iVar9);
      }
    } while ((ls->t).token == 0x104);
    iVar9 = testnext(ls,0x103);
    if (iVar9 != 0) {
      block(ls);
    }
    check_match(ls,0x105,0x10a,iVar12);
    iVar9 = local_74;
    goto LAB_00142d19;
  case 0x10c:
    luaX_next(ls);
    iVar12 = testnext(ls,0x108);
    if (iVar12 == 0) {
      pFVar18 = ls->fs;
      iVar12 = -1;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        pTVar15 = str_checkname(ls);
        iVar9 = new_localvar(ls,pTVar15);
        iVar8 = testnext(ls,0x3c);
        lVar19 = (long)iVar9;
        if (iVar8 == 0) {
          uVar6 = 0;
LAB_00143006:
          *(undefined1 *)
           ((long)(pFVar18->ls->dyd->actvar).arr + (pFVar18->firstlocal + lVar19) * 0x18 + 9) =
               uVar6;
        }
        else {
          pTVar15 = str_checkname(ls);
          pcVar17 = pTVar15->contents;
          checknext(ls,0x3e);
          iVar9 = strcmp(pcVar17,"const");
          if (iVar9 == 0) {
            uVar6 = 1;
            goto LAB_00143006;
          }
          iVar9 = strcmp(pcVar17,"close");
          if (iVar9 != 0) {
            pcVar17 = luaO_pushfstring(ls->L,"unknown attribute \'%s\'",pcVar17);
            goto LAB_00143252;
          }
          *(undefined1 *)
           ((long)(pFVar18->ls->dyd->actvar).arr + (pFVar18->firstlocal + lVar19) * 0x18 + 9) = 2;
          if (iVar12 != -1) {
            luaK_semerror(ls,"multiple to-be-closed variables in local list");
          }
          iVar12 = (uint)pFVar18->nactvar + iVar10;
        }
        iVar9 = iVar10 + 1;
        iVar8 = testnext(ls,0x2c);
      } while (iVar8 != 0);
      iVar8 = testnext(ls,0x3d);
      if (iVar8 == 0) {
        bl1.previous = (BlockCnt *)((ulong)bl1.previous & 0xffffffff00000000);
        iVar8 = 0;
      }
      else {
        iVar8 = explist(ls,(expdesc *)&bl1);
      }
      if (((iVar8 == iVar9) &&
          (v = (pFVar18->ls->dyd->actvar).arr + pFVar18->firstlocal + lVar19, (v->vd).kind == '\x01'
          )) && (iVar11 = luaK_exp2const(pFVar18,(expdesc *)&bl1,&v->k), iVar11 != 0)) {
        (v->vd).kind = '\x03';
        adjustlocalvars(ls,iVar10);
        pFVar18->nactvar = pFVar18->nactvar + '\x01';
      }
      else {
        adjust_assign(ls,iVar9,iVar8,(expdesc *)&bl1);
        adjustlocalvars(ls,iVar9);
      }
      if (iVar12 != -1) {
        pBVar5 = pFVar18->bl;
        pBVar5->upval = '\x01';
        pBVar5->insidetbc = '\x01';
        pFVar18->needclose = '\x01';
        iVar12 = reglevel(pFVar18,iVar12);
        luaK_codeABCk(pFVar18,OP_TBC,iVar12,0,0,0);
      }
    }
    else {
      pFVar18 = ls->fs;
      bVar2 = pFVar18->nactvar;
      pTVar15 = str_checkname(ls);
      new_localvar(ls,pTVar15);
      adjustlocalvars(ls,1);
      body(ls,(expdesc *)&bl1,0,ls->linenumber);
      iVar12 = pFVar18->pc;
      pLVar14 = localdebuginfo(pFVar18,(uint)bVar2);
      pLVar14->startpc = iVar12;
    }
    break;
  case 0x110:
    pFVar18 = ls->fs;
    iVar9 = luaK_getlabel(pFVar18);
    enterblock(pFVar18,&bl1,'\x01');
    enterblock(pFVar18,&local_48,'\0');
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x114,0x110,iVar12);
    iVar12 = cond(ls);
    leaveblock(pFVar18);
    if (local_48.upval != '\0') {
      iVar8 = luaK_jump(pFVar18);
      luaK_patchtohere(pFVar18,iVar12);
      iVar12 = reglevel(pFVar18,(uint)local_48.nactvar);
      luaK_codeABCk(pFVar18,OP_CLOSE,iVar12,0,0,0);
      iVar12 = luaK_jump(pFVar18);
      luaK_patchtohere(pFVar18,iVar8);
    }
    luaK_patchlist(pFVar18,iVar12,iVar9);
LAB_001431e2:
    leaveblock(pFVar18);
    break;
  case 0x111:
    luaX_next(ls);
    pFVar18 = ls->fs;
    iVar8 = luaY_nvarstack(pFVar18);
    iVar12 = (ls->t).token;
    uVar7 = iVar12 - 0x103;
    iVar9 = 0;
    if (((0x1d < uVar7) || ((0x20020007U >> (uVar7 & 0x1f) & 1) == 0)) && (iVar12 != 0x3b)) {
      iVar9 = explist(ls,(expdesc *)&bl1);
      if (((uint)bl1.previous & 0xfffffffe) == 0x12) {
        iVar12 = -1;
        luaK_setreturns(pFVar18,(expdesc *)&bl1,-1);
        bVar20 = iVar9 == 1;
        iVar9 = iVar12;
        if (((bVar20) && ((uint)bl1.previous == 0x12)) && (pFVar18->bl->insidetbc == '\0')) {
          pIVar4 = pFVar18->f->code;
          pIVar4[bl1.firstlabel] = pIVar4[bl1.firstlabel] & 0xffffff80 | 0x45;
        }
      }
      else if (iVar9 == 1) {
        iVar8 = luaK_exp2anyreg(pFVar18,(expdesc *)&bl1);
        iVar9 = 1;
      }
      else {
        luaK_exp2nextreg(pFVar18,(expdesc *)&bl1);
      }
    }
    luaK_ret(pFVar18,iVar8,iVar9);
    testnext(ls,0x3b);
    break;
  case 0x115:
    pFVar18 = ls->fs;
    luaX_next(ls);
    iVar8 = luaK_getlabel(pFVar18);
    iVar9 = cond(ls);
    enterblock(pFVar18,&bl1,'\x01');
    checknext(ls,0x102);
    block(ls);
    iVar10 = luaK_jump(pFVar18);
    luaK_patchlist(pFVar18,iVar10,iVar8);
    check_match(ls,0x105,0x115,iVar12);
    leaveblock(pFVar18);
LAB_00142d19:
    luaK_patchtohere(pFVar18,iVar9);
    break;
  default:
    if (iVar9 == 0x11f) {
      luaX_next(ls);
      pTVar15 = str_checkname(ls);
      checknext(ls,0x11f);
      while ((iVar9 = (ls->t).token, iVar9 == 0x11f || (iVar9 == 0x3b))) {
        statement(ls);
      }
      pLVar16 = findlabel(ls,pTVar15);
      if (pLVar16 != (Labeldesc *)0x0) {
        pcVar17 = luaO_pushfstring(ls->L,"label \'%s\' already defined on line %d",pTVar15->contents
                                   ,(ulong)(uint)pLVar16->line);
LAB_00143252:
        luaK_semerror(ls,pcVar17);
      }
      iVar8 = 1;
      if ((2 < iVar9 - 0x103U) && (iVar9 != 0x120)) {
        iVar8 = 0;
      }
      createlabel(ls,pTVar15,iVar12,iVar8);
      break;
    }
    if (iVar9 == 0x3b) {
      luaX_next(ls);
      break;
    }
    goto switchD_00142706_caseD_103;
  }
LAB_001431e7:
  pFVar18 = ls->fs;
  iVar12 = luaY_nvarstack(pFVar18);
  pFVar18->freereg = (lu_byte)iVar12;
  plVar1 = &ls->L->nCcalls;
  *plVar1 = *plVar1 - 1;
  return;
switchD_00142706_caseD_103:
  pFVar18 = ls->fs;
  suffixedexp(ls,(expdesc *)&bl1.firstlabel);
  iVar12 = (ls->t).token;
  if ((iVar12 == 0x3d) || (iVar12 == 0x2c)) {
    bl1.previous = (BlockCnt *)0x0;
    restassign(ls,(LHS_assign *)&bl1,1);
  }
  else {
    if (bl1.firstlabel != 0x12) {
      pcVar17 = "syntax error";
LAB_00143293:
      luaX_syntaxerror(ls,pcVar17);
    }
    *(undefined1 *)((long)pFVar18->f->code + (long)(int)bl1._16_4_ * 4 + 3) = 1;
  }
  goto LAB_001431e7;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}